

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

QRegion * __thiscall QRegion::operator=(QRegion *this,QRegion *r)

{
  QRegionData *pQVar1;
  
  pQVar1 = r->d;
  if ((pQVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
    LOCK();
    (pQVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar1 = this->d;
  if ((pQVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
    LOCK();
    (pQVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      cleanUp(this->d);
    }
  }
  this->d = r->d;
  return this;
}

Assistant:

QRegion &QRegion::operator=(const QRegion &r)
{
    r.d->ref.ref();
    if (!d->ref.deref())
        cleanUp(d);
    d = r.d;
    return *this;
}